

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

int __thiscall hanabi_learning_env::HanabiState::Score(HanabiState *this)

{
  int iVar1;
  int *piVar2;
  
  if (this->life_tokens_ < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    for (piVar2 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar2 != (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
      iVar1 = iVar1 + *piVar2;
    }
  }
  return iVar1;
}

Assistant:

int HanabiState::Score() const {
  if (LifeTokens() <= 0) {
    return 0;
  }
  return std::accumulate(fireworks_.begin(), fireworks_.end(), 0);
}